

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O2

double getAvgLength(Settings *s,Data *d)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  long lVar7;
  ostream *poVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  iVar3 = d->ntrkptsum;
  pdVar4 = (d->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (d->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar9 = 1;
  if (1 < iVar3) {
    iVar9 = iVar3;
  }
  dVar14 = 0.0;
  uVar11 = 0;
  uVar10 = 0;
  do {
    while( true ) {
      if (iVar9 - 1 == uVar11) {
        dVar14 = (dVar14 / (double)iVar3) / s->degPerPix;
        std::operator<<((ostream *)&std::cout,"Average track length = ");
        poVar8 = std::ostream::_M_insert<double>(dVar14);
        poVar8 = std::operator<<(poVar8," pixels");
        std::endl<char,std::char_traits<char>>(poVar8);
        return dVar14;
      }
      if (uVar11 == (d->iEndSeg).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar10]) break;
      lVar6 = uVar11 + 1;
      lVar7 = uVar11 + 1;
      pdVar1 = pdVar4 + uVar11;
      pdVar2 = pdVar5 + uVar11;
      uVar11 = uVar11 + 1;
      dVar12 = pdVar4[lVar6] - *pdVar1;
      dVar13 = pdVar5[lVar7] - *pdVar2;
      dVar14 = dVar14 + SQRT(dVar13 * dVar13 + dVar12 * dVar12);
    }
    uVar10 = uVar10 + 1;
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

double getAvgLength(Settings& s, Data& d)
{
	double lensum = 0;
	unsigned int iseg = 0;
	for (int i = 0; i < d.ntrkptsum - 1; i++)
	{
		if (i == d.iEndSeg[iseg])
		{
			iseg++;
		}
		else
		{
			double len = sqrt(pow(d.lats[i+1] - d.lats[i], 2)
			                + pow(d.lons[i+1] - d.lons[i], 2));
			lensum += len;
			//std::cout << "len = " << len << "\n";
		}
	}

	double lenavg = lensum / d.ntrkptsum;
	double lenavgpix = lenavg / s.degPerPix;

	//std::cout << "lensum    = " << lensum    << std::endl;
	//std::cout << "lenavg    = " << lenavg    << std::endl;
	//std::cout << "lenavgpix / s.r = " << lenavgpix / s.r << std::endl;

	std::cout << "Average track length = " << lenavgpix
			<< " pixels" << std::endl;

	return lenavgpix;
}